

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<asd::FrameHeader> * __thiscall
pybind11::class_<asd::FrameHeader>::def_readwrite<asd::FrameHeader,bool,char[40]>
          (class_<asd::FrameHeader> *this,char *name,offset_in_Header<asd::version<0UL>_>_to_int pm,
          char (*extra) [40])

{
  cpp_function fset;
  cpp_function fget;
  is_method local_48;
  cpp_function local_40;
  is_method local_38;
  is_method local_30;
  
  local_48.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_38.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<asd::FrameHeader>::def_readwrite<asd::FrameHeader,bool,char[40]>(char_const*,bool_asd::FrameHeader::*,char_const(&)[40])::_lambda(asd::FrameHeader_const&)_1_,pybind11::is_method,void>
            (&local_40,(type *)&local_38,&local_48);
  local_30.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_38.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<asd::FrameHeader>::def_readwrite<asd::FrameHeader,bool,char[40]>(char_const*,bool_asd::FrameHeader::*,char_const(&)[40])::_lambda(asd::FrameHeader&,bool_const&)_1_,pybind11::is_method,void>
            ((cpp_function *)&local_48,(type *)&local_38,&local_30);
  local_30.class_.m_ptr._0_1_ = 6;
  local_38.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  def_property_static<pybind11::is_method,pybind11::return_value_policy,char[40]>
            (this,name,&local_40,(cpp_function *)&local_48,&local_38,
             (return_value_policy *)&local_30,extra);
  object::~object((object *)&local_48);
  object::~object((object *)&local_40);
  return this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra &...extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value,
                      "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D & { return c.*pm; }, is_method(*this)),
            fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }